

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPHINFPortLocation(ndicapi *pol,char *location)

{
  int local_24;
  char *pcStack_20;
  int i;
  char *dp;
  char *location_local;
  ndicapi *pol_local;
  
  pcStack_20 = pol->PhinfPortLocation;
  for (local_24 = 0; local_24 < 0xe; local_24 = local_24 + 1) {
    location[local_24] = *pcStack_20;
    pcStack_20 = pcStack_20 + 1;
  }
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFPortLocation(ndicapi* pol, char location[14])
{
  char* dp;
  int i;

  dp = pol->PhinfPortLocation;

  for (i = 0; i < 14; i++)
  {
    location[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}